

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

int __thiscall bdNodeManager::startDht(bdNodeManager *this)

{
  time_t tVar1;
  time_t now;
  bdNodeManager *this_local;
  
  tVar1 = time((time_t *)0x0);
  bdNode::restartNode(&this->super_bdNode);
  this->mMode = 1;
  this->mModeTS = tVar1;
  this->mStartTS = tVar1;
  this->mSearchingDone = false;
  this->mSearchTS = tVar1;
  return 1;
}

Assistant:

int	bdNodeManager::startDht() {
	time_t now = time(NULL);

	/* set startup mode */
	restartNode();

	mMode = BITDHT_MGR_STATE_STARTUP;
	mModeTS = now;

	mStartTS = now;
	mSearchingDone = false;
	mSearchTS = now;

	return 1;
}